

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wu_2009.h
# Opt level: O3

void __thiscall
SAUF<UFPC>::PerformLabelingMem
          (SAUF<UFPC> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  Mat1b *pMVar5;
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  pointer piVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  undefined1 (*pauVar13) [16];
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  uint j;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  double dVar22;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  undefined1 local_2a0 [104];
  Mat local_238 [16];
  long local_228;
  long *local_1f0;
  Size local_1d8;
  undefined4 local_1d0;
  Mat *local_1c8;
  undefined8 local_1c0;
  Mat_<int> local_1b8;
  undefined1 local_158 [104];
  Mat local_f0 [16];
  long local_e0;
  long *local_a8;
  Mat local_90 [96];
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar11 = *(uint *)&pMVar5->field_0x8;
  uVar3 = *(uint *)&pMVar5->field_0xc;
  UFPC::MemAlloc(((int)((uVar3 - ((int)(uVar3 + 1) >> 0x1f)) + 1) >> 1) *
                 ((int)((uVar11 - ((int)(uVar11 + 1) >> 0x1f)) + 1) >> 1) + 1);
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_158,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar2 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_1d8.height = (int)uVar2;
  local_1d8.width = (int)((ulong)uVar2 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_2a0,&local_1d8,0);
  *UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  UFPC::length_ = 1;
  if ((int)uVar11 < 1) {
    uVar11 = UFPC::MemFlatten();
    (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar11;
  }
  else {
    lVar20 = -1;
    uVar21 = 0;
    do {
      if (0 < (int)uVar3) {
        lVar16 = 0;
        lVar19 = -1;
        do {
          lVar15 = *local_a8;
          lVar12 = lVar15 * uVar21 + local_e0;
          piVar1 = (int *)(lVar12 + 4 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          lVar18 = *(long *)local_158._80_8_;
          lVar14 = lVar18 * uVar21 + local_158._24_8_;
          if (*(char *)(lVar19 + 1 + lVar14) != '\0') {
            if (uVar21 == 0) {
              lVar15 = lVar19;
              if (lVar19 == -1) {
LAB_001cbf70:
                uVar10 = UFPC::length_;
                lVar15 = (long)(int)UFPC::length_;
                UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar15] =
                     UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar15] + 1;
                UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar15] = uVar10;
                uVar10 = UFPC::length_;
                UFPC::length_ = UFPC::length_ + 1;
LAB_001cbf89:
                piVar1 = (int *)(*local_1f0 * uVar21 + local_228 + 4 + lVar19 * 4);
                *piVar1 = *piVar1 + 1;
                lVar18 = *(long *)local_2a0._80_8_ * uVar21 + local_2a0._24_8_;
              }
              else {
LAB_001cbe62:
                piVar1 = (int *)(lVar12 + lVar15 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar14 + lVar15) == '\0') goto LAB_001cbf70;
                lVar12 = *local_1f0 * uVar21 + local_228;
                piVar1 = (int *)(lVar12 + lVar15 * 4);
                *piVar1 = *piVar1 + 1;
                lVar18 = *(long *)local_2a0._80_8_ * uVar21 + local_2a0._24_8_;
                uVar10 = *(uint *)(lVar18 + lVar15 * 4);
                piVar1 = (int *)(lVar12 + 4 + lVar19 * 4);
                *piVar1 = *piVar1 + 1;
              }
            }
            else {
              lVar15 = local_e0 + lVar15 * lVar20;
              piVar1 = (int *)(lVar15 + 4 + lVar19 * 4);
              *piVar1 = *piVar1 + 1;
              lVar18 = local_158._24_8_ + lVar18 * lVar20;
              if (*(char *)(lVar19 + 1 + lVar18) == '\0') {
                if ((lVar19 + 1 < (long)(int)uVar3 + -1) &&
                   (piVar1 = (int *)(lVar15 + 8 + lVar19 * 4), *piVar1 = *piVar1 + 1,
                   *(char *)(lVar19 + 2 + lVar18) != '\0')) {
                  if (lVar19 == -1) {
LAB_001cc000:
                    lVar15 = *local_1f0;
                    piVar1 = (int *)(lVar20 * lVar15 + local_228 + 8 + lVar19 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar18 = *(long *)local_2a0._80_8_;
                    uVar10 = *(uint *)(lVar20 * lVar18 + local_2a0._24_8_ + 8 + lVar19 * 4);
                    piVar1 = (int *)(lVar15 * uVar21 + local_228 + 4 + lVar19 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar18 = lVar18 * uVar21 + local_2a0._24_8_;
                    goto LAB_001cbfb9;
                  }
                  piVar1 = (int *)(lVar15 + lVar19 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar19 + lVar18) == '\0') {
                    piVar1 = (int *)(lVar12 + lVar19 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar19 + lVar14) == '\0') goto LAB_001cc000;
                    lVar15 = *local_1f0;
                    piVar1 = (int *)(uVar21 * lVar15 + local_228 + lVar19 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar18 = *(long *)local_2a0._80_8_;
                    uVar10 = *(uint *)(uVar21 * lVar18 + local_2a0._24_8_ + lVar19 * 4);
                    piVar1 = (int *)(lVar15 * lVar20 + local_228 + 8 + lVar19 * 4);
                    *piVar1 = *piVar1 + 1;
                    j = *(uint *)(lVar18 * lVar20 + local_2a0._24_8_ + 8 + lVar19 * 4);
                  }
                  else {
                    lVar15 = *local_1f0 * lVar20 + local_228;
                    piVar1 = (int *)(lVar15 + lVar19 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar18 = *(long *)local_2a0._80_8_ * lVar20 + local_2a0._24_8_;
                    uVar10 = *(uint *)(lVar18 + lVar19 * 4);
                    piVar1 = (int *)(lVar15 + 8 + lVar19 * 4);
                    *piVar1 = *piVar1 + 1;
                    j = *(uint *)(lVar18 + 8 + lVar19 * 4);
                  }
                  uVar10 = UFPC::MemMerge(uVar10,j);
                  goto LAB_001cbf89;
                }
                if (lVar19 == -1) goto LAB_001cbf70;
                piVar1 = (int *)(lVar15 + lVar19 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar19 + lVar18) == '\0') {
                  lVar15 = lVar16 + -1;
                  goto LAB_001cbe62;
                }
                lVar15 = *local_1f0;
                piVar1 = (int *)(lVar20 * lVar15 + local_228 + lVar19 * 4);
                *piVar1 = *piVar1 + 1;
                lVar18 = *(long *)local_2a0._80_8_;
                uVar10 = *(uint *)(lVar20 * lVar18 + local_2a0._24_8_ + lVar19 * 4);
              }
              else {
                lVar15 = *local_1f0;
                piVar1 = (int *)(lVar20 * lVar15 + local_228 + 4 + lVar19 * 4);
                *piVar1 = *piVar1 + 1;
                lVar18 = *(long *)local_2a0._80_8_;
                uVar10 = *(uint *)(lVar20 * lVar18 + local_2a0._24_8_ + 4 + lVar19 * 4);
              }
              piVar1 = (int *)(lVar15 * uVar21 + local_228 + 4 + lVar19 * 4);
              *piVar1 = *piVar1 + 1;
              lVar18 = lVar18 * uVar21 + local_2a0._24_8_;
            }
LAB_001cbfb9:
            *(uint *)(lVar18 + 4 + lVar19 * 4) = uVar10;
          }
          lVar16 = lVar16 + 1;
          lVar15 = lVar19 - (ulong)uVar3;
          lVar19 = lVar19 + 1;
        } while (lVar15 != -2);
      }
      uVar21 = uVar21 + 1;
      lVar20 = lVar20 + 1;
    } while (uVar21 != uVar11);
    uVar10 = UFPC::MemFlatten();
    (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar10;
    piVar9 = UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar8 = UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)uVar11) {
      uVar21 = 0;
      do {
        if (0 < (int)uVar3) {
          lVar20 = *local_1f0 * uVar21 + local_228;
          lVar19 = *(long *)local_2a0._80_8_ * uVar21 + local_2a0._24_8_;
          uVar17 = 0;
          do {
            piVar1 = (int *)(lVar20 + uVar17 * 4);
            *piVar1 = *piVar1 + 1;
            iVar4 = *(int *)(lVar19 + uVar17 * 4);
            piVar9[iVar4] = piVar9[iVar4] + 1;
            uVar10 = puVar8[iVar4];
            piVar1 = (int *)(lVar20 + uVar17 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(lVar19 + uVar17 * 4) = uVar10;
            uVar17 = uVar17 + 1;
          } while (uVar3 != uVar17);
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != uVar11);
    }
  }
  pauVar13 = (undefined1 (*) [16])operator_new(0x20);
  pauVar13[1] = (undefined1  [16])0x0;
  *pauVar13 = (undefined1  [16])0x0;
  puVar6 = (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)pauVar13;
  (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(pauVar13 + 2);
  (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(pauVar13 + 2);
  if (puVar6 != (pointer)0x0) {
    operator_delete(puVar6,(long)puVar7 - (long)puVar6);
  }
  local_1c0 = 0;
  local_1d0 = 0x81010004;
  local_1c8 = local_f0;
  cv::sum((_InputArray *)&local_1b8);
  *(accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_1b8._0_8_ - 9.223372036854776e+18) &
       (long)(double)local_1b8._0_8_ >> 0x3f | (long)(double)local_1b8._0_8_;
  local_1c0 = 0;
  local_1d0 = 0x81010004;
  local_1c8 = local_238;
  cv::sum((_InputArray *)&local_1b8);
  puVar6 = (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6[1] = (long)((double)local_1b8._0_8_ - 9.223372036854776e+18) &
              (long)(double)local_1b8._0_8_ >> 0x3f | (long)(double)local_1b8._0_8_;
  if ((long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar21 = 0;
  }
  else {
    lVar20 = (long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar22 = 0.0;
    lVar19 = 0;
    do {
      dVar22 = dVar22 + (double)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar19];
      lVar19 = lVar19 + 1;
    } while (lVar20 + (ulong)(lVar20 == 0) != lVar19);
    uVar21 = (long)(dVar22 - 9.223372036854776e+18) & (long)dVar22 >> 0x3f | (long)dVar22;
  }
  puVar6[2] = uVar21;
  MemMat<int>::GetImage(&local_1b8,(MemMat<int> *)local_2a0);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     &local_1b8.super_Mat);
  cv::Mat::~Mat(&local_1b8.super_Mat);
  cv::Mat::~Mat(local_238);
  cv::Mat::~Mat((Mat *)(local_2a0 + 8));
  cv::Mat::~Mat(local_f0);
  cv::Mat::~Mat((Mat *)(local_158 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY); // Equivalence solver

        // Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        LabelsSolver::MemSetup();

        // First scan

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        for (int r = 0; r < h; ++r) {
            for (int c = 0; c < w; ++c) {
#define CONDITION_P c > 0 && r > 0 && img(r - 1 , c - 1) > 0
#define CONDITION_Q r > 0 && img(r - 1, c)>0
#define CONDITION_R c < w - 1 && r > 0 && img(r - 1,c + 1) > 0
#define CONDITION_S c > 0 && img(r,c - 1)>0
#define CONDITION_X img(r,c)>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); // new label
#define ACTION_3 img_labels(r, c) = img_labels(r - 1, c - 1); // x <- p
#define ACTION_4 img_labels(r, c) = img_labels(r - 1, c); // x <- q
#define ACTION_5 img_labels(r, c) = img_labels(r - 1, c + 1); // x <- r
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 1); // x <- s
#define ACTION_7 img_labels(r, c) = LabelsSolver::MemMerge((unsigned)img_labels(r - 1, c - 1), (unsigned)img_labels(r - 1, c + 1)); // x <- p + r
#define ACTION_8 img_labels(r, c) = LabelsSolver::MemMerge((unsigned)img_labels(r, c - 1), (unsigned)img_labels(r - 1, c + 1)); // x <- s + r

#include "labeling_wu_2009_tree.inc.h"              
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::MemFlatten();

        for (int r = 0; r < h; ++r) {
            for (int c = 0; c < w; ++c) {
                img_labels(r, c) = LabelsSolver::MemGetLabel(img_labels(r, c));
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
    }